

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int ssl_check_no_sig_alg_duplication(uint16_t *sig_algs)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (*sig_algs != 0) {
    iVar1 = 0;
    lVar3 = 0;
    do {
      if (lVar3 != 0) {
        lVar2 = 0;
        do {
          if (sig_algs[lVar3] == sig_algs[lVar2]) {
            printf(" entry(%04x,%zu) is duplicated at %zu\n",(ulong)sig_algs[lVar3],lVar2,lVar3);
            iVar1 = -1;
          }
          lVar2 = lVar2 + 1;
        } while (lVar3 != lVar2);
      }
      lVar2 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while (sig_algs[lVar2] != 0);
    return iVar1;
  }
  return 0;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_check_no_sig_alg_duplication(uint16_t *sig_algs)
{
    size_t i, j;
    int ret = 0;

    for (i = 0; sig_algs[i] != MBEDTLS_TLS_SIG_NONE; i++) {
        for (j = 0; j < i; j++) {
            if (sig_algs[i] != sig_algs[j]) {
                continue;
            }
            mbedtls_printf(" entry(%04x,%" MBEDTLS_PRINTF_SIZET
                           ") is duplicated at %" MBEDTLS_PRINTF_SIZET "\n",
                           sig_algs[i], j, i);
            ret = -1;
        }
    }
    return ret;
}